

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveRPathDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths,string *path,bool *resolved)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  string_view str;
  string_view str_00;
  string searchFile;
  cmBinUtilsMacOSMachOLinker *pcVar4;
  
  pbVar3 = (rpaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (rpaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar3 == pbVar1) {
      *resolved = false;
      return true;
    }
    std::__cxx11::string::string((string *)&searchFile,(string *)name);
    std::__cxx11::string::replace((ulong)&searchFile,0,(string *)&DAT_00000006);
    str._M_str = searchFile._M_dataplus._M_p;
    str._M_len = searchFile._M_string_length;
    pcVar4 = (cmBinUtilsMacOSMachOLinker *)searchFile._M_string_length;
    bVar2 = cmHasLiteralPrefix<14ul>(str,(char (*) [14])"@loader_path/");
    if (bVar2) {
      ResolveLoaderPathDependency(pcVar4,&searchFile,loaderPath,path,resolved);
LAB_004500c7:
      if (*resolved != false) {
LAB_00450100:
        std::__cxx11::string::~string((string *)&searchFile);
        return true;
      }
    }
    else {
      str_00._M_str = searchFile._M_dataplus._M_p;
      str_00._M_len = searchFile._M_string_length;
      pcVar4 = (cmBinUtilsMacOSMachOLinker *)searchFile._M_string_length;
      bVar2 = cmHasLiteralPrefix<18ul>(str_00,(char (*) [18])"@executable_path/");
      if (bVar2) {
        ResolveExecutablePathDependency(pcVar4,&searchFile,executablePath,path,resolved);
        goto LAB_004500c7;
      }
      bVar2 = cmsys::SystemTools::PathExists(&searchFile);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)path);
        *resolved = true;
        goto LAB_00450100;
      }
    }
    std::__cxx11::string::~string((string *)&searchFile);
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveRPathDependency(
  std::string const& name, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths,
  std::string& path, bool& resolved)
{
  for (std::string const& rpath : rpaths) {
    std::string searchFile = name;
    searchFile.replace(0, 6, rpath);
    if (cmHasLiteralPrefix(searchFile, "@loader_path/")) {
      if (!this->ResolveLoaderPathDependency(searchFile, loaderPath, path,
                                             resolved)) {
        return false;
      }
      if (resolved) {
        return true;
      }
    } else if (cmHasLiteralPrefix(searchFile, "@executable_path/")) {
      if (!this->ResolveExecutablePathDependency(searchFile, executablePath,
                                                 path, resolved)) {
        return false;
      }
      if (resolved) {
        return true;
      }
    } else if (cmSystemTools::PathExists(searchFile)) {
      /*
       * paraphrasing @ben.boeckel:
       *  if /b/libB.dylib is supposed to be used,
       *  /a/libbB.dylib will be found first if it exists. CMake tries to
       *  sort rpath directories to avoid this, but sometimes there is no
       *  right answer.
       *
       *  I believe it is possible to resolve this using otools -l
       *  then checking the LC_LOAD_DYLIB command whose name is
       *  equal to the value of search_file, UNLESS the build
       *  specifically sets the RPath to paths that will match
       *  duplicate libs; at this point can we just point to
       *  user error, or is there a reason why the advantages
       *  to this scenario outweigh its disadvantages?
       *
       *  Also priority seems to be the order as passed in when compiled
       *  so as long as this method's resolution guarantees priority
       *  in that manner further checking should not be necessary?
       */
      path = searchFile;
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}